

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)

{
  SQClass *pSVar1;
  SQWeakRef *pSVar2;
  SQObjectPtr *pSVar3;
  SQObjectPtr *pSVar4;
  SQWeakRef *pSVar5;
  SQNativeClosure *pSVar6;
  SQNativeClosure *c_1;
  SQClosure *c;
  SQObjectPtr ret;
  SQWeakRef *w;
  SQObjectPtr *env;
  SQObjectPtr *o;
  SQChar *in_stack_ffffffffffffff88;
  SQVM *in_stack_ffffffffffffff90;
  SQNativeClosure *in_stack_ffffffffffffff98;
  SQVM *in_stack_ffffffffffffffa0;
  SQClosure *in_stack_ffffffffffffffb0;
  SQRESULT local_8;
  
  pSVar3 = stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  if (((pSVar3->super_SQObject)._type == OT_NATIVECLOSURE) ||
     ((pSVar3->super_SQObject)._type == OT_CLOSURE)) {
    pSVar4 = stack_get(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
    if (((pSVar4->super_SQObject)._type == OT_TABLE) ||
       ((((pSVar4->super_SQObject)._type == OT_ARRAY || ((pSVar4->super_SQObject)._type == OT_CLASS)
         ) || ((pSVar4->super_SQObject)._type == OT_INSTANCE)))) {
      pSVar5 = SQRefCounted::GetWeakRef
                         ((SQRefCounted *)in_stack_ffffffffffffffa0,
                          (SQAllocContext)in_stack_ffffffffffffff98,
                          (SQObjectType)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                          (SQObjectFlags)((ulong)in_stack_ffffffffffffff90 >> 0x18));
      SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
      if ((pSVar3->super_SQObject)._type == OT_CLOSURE) {
        pSVar6 = (SQNativeClosure *)SQClosure::Clone(in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffff98 = pSVar6;
        if ((SQWeakRef *)pSVar6->_nparamscheck != (SQWeakRef *)0x0) {
          (((SQWeakRef *)pSVar6->_nparamscheck)->super_SQRefCounted)._uiRef =
               (((SQWeakRef *)pSVar6->_nparamscheck)->super_SQRefCounted)._uiRef - 1;
          if ((((SQWeakRef *)pSVar6->_nparamscheck)->super_SQRefCounted)._uiRef == 0) {
            (*(((SQWeakRef *)pSVar6->_nparamscheck)->super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          pSVar6->_nparamscheck = 0;
        }
        pSVar6->_nparamscheck = (SQInteger)pSVar5;
        (((SQWeakRef *)pSVar6->_nparamscheck)->super_SQRefCounted)._uiRef =
             (((SQWeakRef *)pSVar6->_nparamscheck)->super_SQRefCounted)._uiRef + 1;
        if (((pSVar3->super_SQObject)._unVal.pTable)->_firstfree != (_HashNode *)0x0) {
          (pSVar6->_typecheck)._vals = (long *)((pSVar3->super_SQObject)._unVal.pTable)->_firstfree;
          pSVar1 = (SQClass *)(pSVar6->_typecheck)._vals;
          (pSVar1->super_SQCollectable).super_SQRefCounted._uiRef =
               (pSVar1->super_SQCollectable).super_SQRefCounted._uiRef + 1;
        }
        SQObjectPtr::operator=
                  ((SQObjectPtr *)in_stack_ffffffffffffffa0,(SQClosure *)in_stack_ffffffffffffff98);
      }
      else {
        in_stack_ffffffffffffff90 =
             (SQVM *)SQNativeClosure::Clone((SQNativeClosure *)in_stack_ffffffffffffffa0);
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff90;
        if (*(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject !=
            (SQWeakRef *)0x0) {
          pSVar2 = *(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject;
          (pSVar2->super_SQRefCounted)._uiRef = (pSVar2->super_SQRefCounted)._uiRef - 1;
          if (((*(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject)->
              super_SQRefCounted)._uiRef == 0) {
            (*((*(SQWeakRef **)&(in_stack_ffffffffffffff90->_roottable).super_SQObject)->
              super_SQRefCounted)._vptr_SQRefCounted[2])();
          }
          *(SQWeakRef **)&(in_stack_ffffffffffffffa0->_roottable).super_SQObject = (SQWeakRef *)0x0;
        }
        *(SQWeakRef **)&(in_stack_ffffffffffffffa0->_roottable).super_SQObject = pSVar5;
        pSVar5 = *(SQWeakRef **)&(in_stack_ffffffffffffffa0->_roottable).super_SQObject;
        (pSVar5->super_SQRefCounted)._uiRef = (pSVar5->super_SQRefCounted)._uiRef + 1;
        SQObjectPtr::operator=((SQObjectPtr *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      SQVM::Pop(in_stack_ffffffffffffff90);
      SQVM::Push(in_stack_ffffffffffffffa0,(SQObjectPtr *)in_stack_ffffffffffffff98);
      local_8 = 0;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
    }
    else {
      local_8 = sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  return local_8;
}

Assistant:

SQRESULT sq_bindenv(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(!sq_isnativeclosure(o) &&
        !sq_isclosure(o))
        return sq_throwerror(v,_SC("the target is not a closure"));
    SQObjectPtr &env = stack_get(v,-1);
    if(!sq_istable(env) &&
        !sq_isarray(env) &&
        !sq_isclass(env) &&
        !sq_isinstance(env))
        return sq_throwerror(v,_SC("invalid environment"));
    SQWeakRef *w = _refcounted(env)->GetWeakRef(_ss(v)->_alloc_ctx, sq_type(env), env._flags);
    SQObjectPtr ret;
    if(sq_isclosure(o)) {
        SQClosure *c = _closure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        if(_closure(o)->_base) {
            c->_base = _closure(o)->_base;
            __ObjAddRef(c->_base);
        }
        ret = c;
    }
    else { //then must be a native closure
        SQNativeClosure *c = _nativeclosure(o)->Clone();
        __ObjRelease(c->_env);
        c->_env = w;
        __ObjAddRef(c->_env);
        ret = c;
    }
    v->Pop();
    v->Push(ret);
    return SQ_OK;
}